

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O1

Expected<llvm::DWARFDebugRnglist> * __thiscall
llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::findList
          (Expected<llvm::DWARFDebugRnglist> *__return_storage_ptr__,
          DWARFListTableBase<llvm::DWARFDebugRnglist> *this,DWARFDataExtractor Data,uint64_t Offset)

{
  _Rb_tree_header *p_Var1;
  uint64_t uVar2;
  uint64_t uVar3;
  mapped_type *this_00;
  _Base_ptr p_Var4;
  ulong uVar5;
  _Base_ptr p_Var6;
  size_t in_R9;
  StringRef SectionName;
  uint64_t local_60;
  uint64_t Offset_local;
  uint64_t StartingOffset;
  undefined1 auStack_48 [8];
  DWARFDebugRnglist List;
  pointer local_28;
  Error E;
  
  p_Var1 = &(this->ListMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->ListMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < Offset]) {
    if (*(ulong *)(p_Var6 + 1) >= Offset) {
      p_Var4 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var6 = p_Var4, Offset < *(ulong *)(p_Var4 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  local_60 = Offset;
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    auStack_48 = (undefined1  [8])0x0;
    List.super_DWARFListType<llvm::RangeListEntry>.Entries.
    super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    List.super_DWARFListType<llvm::RangeListEntry>.Entries.
    super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar2 = (this->Header).HeaderOffset;
    uVar3 = DWARFListTableHeader::length(&this->Header);
    Offset_local = local_60;
    SectionName.Length = in_R9;
    SectionName.Data = (char *)&local_60;
    DWARFListType<llvm::RangeListEntry>::extract
              ((DWARFListType<llvm::RangeListEntry> *)&local_28,Data,(uint64_t)auStack_48,
               (this->Header).HeaderOffset,(uint64_t *)(uVar3 + uVar2),SectionName,
               (this->Header).SectionName);
    uVar5 = (ulong)local_28 & 0xfffffffffffffffe;
    if (uVar5 == 0) {
      local_28 = (pointer)(uVar5 != 0 | uVar5);
      this_00 = std::
                map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                ::operator[](&this->ListMap,&Offset_local);
      std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::operator=
                ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)this_00,
                 (vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)auStack_48);
      __return_storage_ptr__->field_0x18 = __return_storage_ptr__->field_0x18 & 0xfe;
      *(undefined1 (*) [8])(__return_storage_ptr__->field_0).ErrorStorage.buffer = auStack_48;
      *(pointer *)((long)&__return_storage_ptr__->field_0 + 8) =
           List.super_DWARFListType<llvm::RangeListEntry>.Entries.
           super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)((long)&__return_storage_ptr__->field_0 + 0x10) =
           List.super_DWARFListType<llvm::RangeListEntry>.Entries.
           super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      auStack_48 = (undefined1  [8])0x0;
      List.super_DWARFListType<llvm::RangeListEntry>.Entries.
      super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      List.super_DWARFListType<llvm::RangeListEntry>.Entries.
      super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    else {
      StartingOffset = (ulong)local_28 | 1;
      local_28 = (pointer)0x0;
      Expected<llvm::DWARFDebugRnglist>::Expected(__return_storage_ptr__,(Error *)&StartingOffset);
      if ((long *)(StartingOffset & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(StartingOffset & 0xfffffffffffffffe) + 8))();
      }
      if ((long *)((ulong)local_28 & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_28 & 0xfffffffffffffffe) + 8))();
      }
    }
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48,
                      (long)List.super_DWARFListType<llvm::RangeListEntry>.Entries.
                            super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
    }
  }
  else {
    __return_storage_ptr__->field_0x18 = __return_storage_ptr__->field_0x18 & 0xfe;
    std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::vector
              ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)
               __return_storage_ptr__,
               (vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)
               &p_Var6[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFListType>
DWARFListTableBase<DWARFListType>::findList(DWARFDataExtractor Data,
                                            uint64_t Offset) {
  auto Entry = ListMap.find(Offset);
  if (Entry != ListMap.end())
    return Entry->second;

  // Extract the list from the section and enter it into the list map.
  DWARFListType List;
  uint64_t End = getHeaderOffset() + Header.length();
  uint64_t StartingOffset = Offset;
  if (Error E =
          List.extract(Data, getHeaderOffset(), End, &Offset,
                       Header.getSectionName(), Header.getListTypeString()))
    return std::move(E);
  ListMap[StartingOffset] = List;
  return List;
}